

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O2

void __thiscall bitfoot::Bitfoot::Evaluate(Bitfoot *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ushort uVar27;
  undefined1 auVar32 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  char cVar43;
  undefined1 auVar44 [12];
  byte bVar52;
  char cVar53;
  byte bVar54;
  char cVar55;
  byte bVar56;
  char cVar57;
  byte bVar58;
  char cVar59;
  byte bVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined4 uVar28;
  undefined6 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  byte bVar42;
  undefined1 auVar45 [12];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar50 [16];
  undefined1 auVar64 [14];
  undefined1 auVar65 [14];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  
  uVar23 = this->state;
  if ((uVar23 & 0x20) != 0) {
    __assert_fail("!(state & Draw)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x6eb,"void bitfoot::Bitfoot::Evaluate()");
  }
  memset(this->pinfo,0,0x130);
  this->atkCount[0] = 0;
  this->atkCount[1] = 0;
  this->atkScore[0] = 0;
  this->atkScore[1] = 0;
  iVar12 = -_tempo;
  if ((uVar23 & 1) == 0) {
    iVar12 = _tempo;
  }
  iVar13 = this->material[0];
  iVar22 = this->material[1];
  iVar1 = this->sqrVal[0];
  iVar2 = this->sqrVal[1];
  iVar9 = GetPins<true>(this,6);
  iVar10 = GetPins<false>(this,6);
  if (this->pc[2] == 0) {
    iVar11 = -0x32;
  }
  else {
    iVar11 = PawnEval<false>(this);
  }
  iVar11 = ((iVar1 + iVar9 + iVar12 + iVar13) - (iVar22 + iVar2 + iVar10)) + iVar11;
  if (this->pc[3] == 0) {
    iVar11 = iVar11 + 0x32;
  }
  else {
    iVar12 = PawnEval<true>(this);
    iVar11 = iVar11 - iVar12;
  }
  if (this->pc[4] != 0) {
    iVar12 = KnightEval<false>(this);
    iVar11 = iVar11 + iVar12;
  }
  if (this->pc[5] != 0) {
    iVar12 = KnightEval<true>(this);
    iVar11 = iVar11 - iVar12;
  }
  if (this->pc[6] != 0) {
    iVar12 = BishopEval<false>(this);
    iVar11 = iVar11 + iVar12;
  }
  if (this->pc[7] != 0) {
    iVar12 = BishopEval<true>(this);
    iVar11 = iVar11 - iVar12;
  }
  if (this->pc[8] != 0) {
    iVar12 = RookEval<false>(this);
    iVar11 = iVar11 + iVar12;
  }
  if (this->pc[9] != 0) {
    iVar12 = RookEval<true>(this);
    iVar11 = iVar11 - iVar12;
  }
  if (this->pc[10] != 0) {
    iVar12 = QueenEval<false>(this);
    iVar11 = iVar11 + iVar12;
  }
  if (this->pc[0xb] != 0) {
    iVar12 = QueenEval<true>(this);
    iVar11 = iVar11 - iVar12;
  }
  uVar16 = this->atks[3];
  uVar21 = this->atks[5];
  uVar20 = this->atks[7];
  uVar3 = this->atks[9];
  uVar19 = this->atks[0xb];
  this->atks[0] = this->atks[10] | this->atks[8] | this->atks[6] | this->atks[4] | this->atks[2];
  this->atks[1] = uVar19 | uVar3 | uVar20 | uVar21 | uVar16;
  iVar12 = KingEval<false>(this);
  iVar13 = KingEval<true>(this);
  iVar13 = (iVar12 + iVar11) - iVar13;
  uVar16 = (&_KING_ATK)[this->king[0]];
  this->atks[0xc] = uVar16;
  uVar19 = (&_KING_ATK)[this->king[1]];
  this->atks[0xd] = uVar19;
  uVar20 = this->atks[3];
  uVar3 = this->atks[5];
  uVar21 = this->atks[7];
  uVar6 = this->atks[9];
  uVar7 = this->atks[0xb];
  this->atks[0] =
       uVar16 | this->atks[10] | this->atks[8] | this->atks[6] | this->atks[4] | this->atks[2];
  this->atks[1] = uVar19 | uVar7 | uVar6 | uVar21 | uVar3 | uVar20;
  if (this->pinfo[0].passed != 0) {
    iVar12 = PasserEval<false>(this);
    iVar13 = iVar13 + iVar12;
  }
  if (this->pinfo[1].passed != 0) {
    iVar12 = PasserEval<true>(this);
    iVar13 = iVar13 - iVar12;
  }
  VerifyPosition(this);
  bVar8 = IsDraw(this);
  if (!bVar8) {
    uVar16 = this->atks[0xd] | this->atks[0xc];
    uVar19 = uVar16 | 0x3c3c3c3c0000;
    auVar35._8_4_ = (int)uVar19;
    auVar35._0_8_ = uVar19;
    auVar35._12_4_ = (int)(uVar19 >> 0x20);
    auVar35 = auVar35 & *(undefined1 (*) [16])(this->atks + 10) |
              *(undefined1 (*) [16])(this->atks + 8) | *(undefined1 (*) [16])(this->atks + 6) |
              *(undefined1 (*) [16])(this->atks + 4) | *(undefined1 (*) [16])(this->atks + 2);
    uVar19 = auVar35._0_8_ - (auVar35._0_8_ >> 1 & 0x5555555555555555);
    uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
    uVar20 = auVar35._8_8_ - (auVar35._8_8_ >> 1 & 0x5555555555555555);
    uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
    auVar48 = _DAT_00135060 & auVar35;
    auVar25._0_2_ = auVar48._0_2_ >> 1;
    auVar25._2_2_ = auVar48._2_2_ >> 1;
    auVar25._4_2_ = auVar48._4_2_ >> 1;
    auVar25._6_2_ = auVar48._6_2_ >> 1;
    auVar25._8_2_ = auVar48._8_2_ >> 1;
    auVar25._10_2_ = auVar48._10_2_ >> 1;
    auVar25._12_2_ = auVar48._12_2_ >> 1;
    auVar25._14_2_ = auVar48._14_2_ >> 1;
    auVar25 = auVar25 & _DAT_00135070;
    uVar27 = CONCAT11(auVar48[1] - auVar25[1],auVar48[0] - auVar25[0]);
    uVar28 = CONCAT13(auVar48[3] - auVar25[3],CONCAT12(auVar48[2] - auVar25[2],uVar27));
    uVar29 = CONCAT15(auVar48[5] - auVar25[5],CONCAT14(auVar48[4] - auVar25[4],uVar28));
    uVar30 = CONCAT17(auVar48[7] - auVar25[7],CONCAT16(auVar48[6] - auVar25[6],uVar29));
    auVar44._0_10_ = CONCAT19(auVar48[9] - auVar25[9],CONCAT18(auVar48[8] - auVar25[8],uVar30));
    auVar44[10] = auVar48[10] - auVar25[10];
    auVar44[0xb] = auVar48[0xb] - auVar25[0xb];
    auVar46[0xc] = auVar48[0xc] - auVar25[0xc];
    auVar46._0_12_ = auVar44;
    auVar46[0xd] = auVar48[0xd] - auVar25[0xd];
    auVar67[0xe] = auVar48[0xe] - auVar25[0xe];
    auVar67._0_14_ = auVar46;
    auVar67[0xf] = auVar48[0xf] - auVar25[0xf];
    auVar25 = auVar67 & _DAT_00135080;
    auVar49._0_2_ = uVar27 >> 2;
    auVar49._2_2_ = (ushort)((uint)uVar28 >> 0x12);
    auVar49._4_2_ = (ushort)((uint6)uVar29 >> 0x22);
    auVar49._6_2_ = (ushort)((ulong)uVar30 >> 0x32);
    auVar49._8_2_ = (ushort)((unkuint10)auVar44._0_10_ >> 0x42);
    auVar49._10_2_ = auVar44._10_2_ >> 2;
    auVar49._12_2_ = auVar46._12_2_ >> 2;
    auVar49._14_2_ = auVar67._14_2_ >> 2;
    auVar49 = auVar49 & _DAT_00135080;
    cVar43 = auVar49[0] + auVar25[0];
    bVar52 = auVar49[1] + auVar25[1];
    uVar27 = CONCAT11(bVar52,cVar43);
    cVar53 = auVar49[2] + auVar25[2];
    bVar54 = auVar49[3] + auVar25[3];
    uVar28 = CONCAT13(bVar54,CONCAT12(cVar53,uVar27));
    cVar55 = auVar49[4] + auVar25[4];
    bVar56 = auVar49[5] + auVar25[5];
    uVar29 = CONCAT15(bVar56,CONCAT14(cVar55,uVar28));
    cVar57 = auVar49[6] + auVar25[6];
    bVar58 = auVar49[7] + auVar25[7];
    uVar30 = CONCAT17(bVar58,CONCAT16(cVar57,uVar29));
    cVar59 = auVar49[8] + auVar25[8];
    bVar60 = auVar49[9] + auVar25[9];
    auVar45._0_10_ = CONCAT19(bVar60,CONCAT18(cVar59,uVar30));
    auVar45[10] = auVar49[10] + auVar25[10];
    auVar45[0xb] = auVar49[0xb] + auVar25[0xb];
    auVar47[0xc] = auVar49[0xc] + auVar25[0xc];
    auVar47._0_12_ = auVar45;
    auVar47[0xd] = auVar49[0xd] + auVar25[0xd];
    auVar50[0xe] = auVar49[0xe] + auVar25[0xe];
    auVar50._0_14_ = auVar47;
    auVar50[0xf] = auVar49[0xf] + auVar25[0xf];
    auVar66[0] = (char)(uVar27 >> 4) + cVar43;
    auVar66[1] = (bVar52 >> 4) + bVar52;
    auVar66[2] = (char)(ushort)((uint)uVar28 >> 0x14) + cVar53;
    auVar66[3] = (bVar54 >> 4) + bVar54;
    auVar66[4] = (char)(ushort)((uint6)uVar29 >> 0x24) + cVar55;
    auVar66[5] = (bVar56 >> 4) + bVar56;
    auVar66[6] = (char)(ushort)((ulong)uVar30 >> 0x34) + cVar57;
    auVar66[7] = (bVar58 >> 4) + bVar58;
    auVar66[8] = (char)(ushort)((unkuint10)auVar45._0_10_ >> 0x44) + cVar59;
    auVar66[9] = (bVar60 >> 4) + bVar60;
    auVar66[10] = (char)(auVar45._10_2_ >> 4) + auVar45[10];
    auVar66[0xb] = (auVar45[0xb] >> 4) + auVar45[0xb];
    auVar66[0xc] = (char)(auVar47._12_2_ >> 4) + auVar47[0xc];
    auVar66[0xd] = (auVar47[0xd] >> 4) + auVar47[0xd];
    auVar66[0xe] = (char)(auVar50._14_2_ >> 4) + auVar50[0xe];
    auVar66[0xf] = (auVar50[0xf] >> 4) + auVar50[0xf];
    auVar67 = psadbw(auVar66 & _DAT_00135090,(undefined1  [16])0x0);
    auVar68._8_4_ = (int)uVar16;
    auVar68._0_8_ = uVar16;
    auVar68._12_4_ = (int)(uVar16 >> 0x20);
    auVar68 = auVar68 & auVar35;
    auVar48._0_2_ = auVar68._0_2_ >> 1;
    auVar48._2_2_ = auVar68._2_2_ >> 1;
    auVar48._4_2_ = auVar68._4_2_ >> 1;
    auVar48._6_2_ = auVar68._6_2_ >> 1;
    auVar48._8_2_ = auVar68._8_2_ >> 1;
    auVar48._10_2_ = auVar68._10_2_ >> 1;
    auVar48._12_2_ = auVar68._12_2_ >> 1;
    auVar48._14_2_ = auVar68._14_2_ >> 1;
    auVar48 = auVar48 & _DAT_00135070;
    uVar27 = CONCAT11(auVar68[1] - auVar48[1],auVar68[0] - auVar48[0]);
    uVar28 = CONCAT13(auVar68[3] - auVar48[3],CONCAT12(auVar68[2] - auVar48[2],uVar27));
    uVar29 = CONCAT15(auVar68[5] - auVar48[5],CONCAT14(auVar68[4] - auVar48[4],uVar28));
    uVar30 = CONCAT17(auVar68[7] - auVar48[7],CONCAT16(auVar68[6] - auVar48[6],uVar29));
    auVar62._0_10_ = CONCAT19(auVar68[9] - auVar48[9],CONCAT18(auVar68[8] - auVar48[8],uVar30));
    auVar62[10] = auVar68[10] - auVar48[10];
    auVar62[0xb] = auVar68[0xb] - auVar48[0xb];
    auVar64[0xc] = auVar68[0xc] - auVar48[0xc];
    auVar64._0_12_ = auVar62;
    auVar64[0xd] = auVar68[0xd] - auVar48[0xd];
    auVar69[0xe] = auVar68[0xe] - auVar48[0xe];
    auVar69._0_14_ = auVar64;
    auVar69[0xf] = auVar68[0xf] - auVar48[0xf];
    auVar25 = auVar69 & _DAT_00135080;
    auVar70._0_2_ = uVar27 >> 2;
    auVar70._2_2_ = (ushort)((uint)uVar28 >> 0x12);
    auVar70._4_2_ = (ushort)((uint6)uVar29 >> 0x22);
    auVar70._6_2_ = (ushort)((ulong)uVar30 >> 0x32);
    auVar70._8_2_ = (ushort)((unkuint10)auVar62._0_10_ >> 0x42);
    auVar70._10_2_ = auVar62._10_2_ >> 2;
    auVar70._12_2_ = auVar64._12_2_ >> 2;
    auVar70._14_2_ = auVar69._14_2_ >> 2;
    auVar70 = auVar70 & _DAT_00135080;
    cVar43 = auVar70[0] + auVar25[0];
    bVar52 = auVar70[1] + auVar25[1];
    uVar27 = CONCAT11(bVar52,cVar43);
    cVar53 = auVar70[2] + auVar25[2];
    bVar54 = auVar70[3] + auVar25[3];
    uVar28 = CONCAT13(bVar54,CONCAT12(cVar53,uVar27));
    cVar55 = auVar70[4] + auVar25[4];
    bVar56 = auVar70[5] + auVar25[5];
    uVar29 = CONCAT15(bVar56,CONCAT14(cVar55,uVar28));
    cVar57 = auVar70[6] + auVar25[6];
    bVar58 = auVar70[7] + auVar25[7];
    uVar30 = CONCAT17(bVar58,CONCAT16(cVar57,uVar29));
    cVar59 = auVar70[8] + auVar25[8];
    bVar60 = auVar70[9] + auVar25[9];
    auVar63._0_10_ = CONCAT19(bVar60,CONCAT18(cVar59,uVar30));
    auVar63[10] = auVar70[10] + auVar25[10];
    auVar63[0xb] = auVar70[0xb] + auVar25[0xb];
    auVar65[0xc] = auVar70[0xc] + auVar25[0xc];
    auVar65._0_12_ = auVar63;
    auVar65[0xd] = auVar70[0xd] + auVar25[0xd];
    auVar71[0xe] = auVar70[0xe] + auVar25[0xe];
    auVar71._0_14_ = auVar65;
    auVar71[0xf] = auVar70[0xf] + auVar25[0xf];
    auVar36[0] = (char)(uVar27 >> 4) + cVar43;
    auVar36[1] = (bVar52 >> 4) + bVar52;
    auVar36[2] = (char)(ushort)((uint)uVar28 >> 0x14) + cVar53;
    auVar36[3] = (bVar54 >> 4) + bVar54;
    auVar36[4] = (char)(ushort)((uint6)uVar29 >> 0x24) + cVar55;
    auVar36[5] = (bVar56 >> 4) + bVar56;
    auVar36[6] = (char)(ushort)((ulong)uVar30 >> 0x34) + cVar57;
    auVar36[7] = (bVar58 >> 4) + bVar58;
    auVar36[8] = (char)(ushort)((unkuint10)auVar63._0_10_ >> 0x44) + cVar59;
    auVar36[9] = (bVar60 >> 4) + bVar60;
    auVar36[10] = (char)(auVar63._10_2_ >> 4) + auVar63[10];
    auVar36[0xb] = (auVar63[0xb] >> 4) + auVar63[0xb];
    auVar36[0xc] = (char)(auVar65._12_2_ >> 4) + auVar65[0xc];
    auVar36[0xd] = (auVar65[0xd] >> 4) + auVar65[0xd];
    auVar36[0xe] = (char)(auVar71._14_2_ >> 4) + auVar71[0xe];
    auVar36[0xf] = (auVar71[0xf] >> 4) + auVar71[0xf];
    auVar25 = psadbw(auVar36 & _DAT_00135090,(undefined1  [16])0x0);
    iVar12 = (iVar13 + (uint)(byte)(((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) + auVar25._0_4_ + auVar67._0_4_) -
             ((uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
              + auVar25._8_4_ + auVar67._8_4_);
    uVar16 = this->pc[2];
    uVar19 = this->pc[4];
    uVar20 = (this->pc[6] | uVar16 | uVar19) & ~this->atks[0];
    if (uVar20 != 0) {
      uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
      uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
      iVar12 = iVar12 + (uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) *
                                     0x101010101010101 >> 0x38) * -6;
    }
    uVar20 = this->pc[3];
    uVar3 = this->pc[5];
    uVar21 = (this->pc[7] | uVar20 | uVar3) & ~this->atks[1];
    if (uVar21 != 0) {
      uVar21 = uVar21 - (uVar21 >> 1 & 0x5555555555555555);
      uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
      iVar12 = iVar12 + (uint)(byte)(((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) *
                                     0x101010101010101 >> 0x38) * 6;
    }
    uVar21 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
    uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
    uVar21 = ((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
    iVar13 = (int)((uVar21 >> 0x38) << 4) + -0x10;
    if (uVar21 >> 0x38 < 2) {
      iVar13 = 0;
    }
    uVar21 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
    uVar21 = (uVar21 >> 2 & 0x3333333333333333) + (uVar21 & 0x3333333333333333);
    uVar21 = ((uVar21 >> 4) + uVar21 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
    iVar22 = (uint)(byte)(uVar21 >> 0x38) * 0x10 + -0x10;
    if (uVar21 >> 0x38 < 2) {
      iVar22 = 0;
    }
    uVar23 = iVar22 + (iVar12 - iVar13);
    if (uVar20 != 0 || uVar16 != 0) {
      uVar15 = this->pinfo[0].count;
      uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555);
      uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
      if (uVar15 != (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
         ) {
        __assert_fail("pinfo[White].count == BitCount(pc[WhitePawn])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x74a,"void bitfoot::Bitfoot::Evaluate()");
      }
      uVar14 = this->pinfo[1].count;
      uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
      uVar16 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
      if (uVar14 != (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
         ) {
        __assert_fail("pinfo[Black].count == BitCount(pc[BlackPawn])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x74b,"void bitfoot::Bitfoot::Evaluate()");
      }
      uVar14 = uVar14 + uVar15;
      if (0x10 < uVar14) {
        __assert_fail("count <= 21",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x757,"void bitfoot::Bitfoot::Evaluate()");
      }
      bVar52 = (byte)((char)uVar14 << 2) / 3;
      auVar37._8_8_ = this->pinfo[1].behind;
      auVar37._0_8_ = this->pinfo[0].behind;
      auVar61._8_8_ = ~this->atks[0];
      auVar61._0_8_ = ~this->atks[1];
      auVar61 = auVar61 & auVar37;
      auVar38._0_8_ = auVar61._0_8_ >> 8;
      auVar38._8_8_ = auVar61._8_8_ >> 8;
      auVar38 = auVar38 & auVar61;
      auVar51._0_2_ = auVar38._0_2_ >> 1;
      auVar51._2_2_ = auVar38._2_2_ >> 1;
      auVar51._4_2_ = auVar38._4_2_ >> 1;
      auVar51._6_2_ = auVar38._6_2_ >> 1;
      auVar51._8_2_ = auVar38._8_2_ >> 1;
      auVar51._10_2_ = auVar38._10_2_ >> 1;
      auVar51._12_2_ = auVar38._12_2_ >> 1;
      auVar51._14_2_ = auVar38._14_2_ >> 1;
      auVar51 = auVar51 & _DAT_00135070;
      uVar27 = CONCAT11(auVar38[1] - auVar51[1],auVar38[0] - auVar51[0]);
      uVar28 = CONCAT13(auVar38[3] - auVar51[3],CONCAT12(auVar38[2] - auVar51[2],uVar27));
      uVar29 = CONCAT15(auVar38[5] - auVar51[5],CONCAT14(auVar38[4] - auVar51[4],uVar28));
      uVar30 = CONCAT17(-auVar51[7],CONCAT16(auVar38[6] - auVar51[6],uVar29));
      auVar31._0_10_ = CONCAT19(auVar38[9] - auVar51[9],CONCAT18(auVar38[8] - auVar51[8],uVar30));
      auVar31[10] = auVar38[10] - auVar51[10];
      auVar31[0xb] = auVar38[0xb] - auVar51[0xb];
      auVar33[0xc] = auVar38[0xc] - auVar51[0xc];
      auVar33._0_12_ = auVar31;
      auVar33[0xd] = auVar38[0xd] - auVar51[0xd];
      auVar39[0xe] = auVar38[0xe] - auVar51[0xe];
      auVar39._0_14_ = auVar33;
      auVar39[0xf] = auVar38[0xf] - auVar51[0xf];
      auVar25 = auVar39 & _DAT_00135080;
      auVar40._0_2_ = uVar27 >> 2;
      auVar40._2_2_ = (ushort)((uint)uVar28 >> 0x12);
      auVar40._4_2_ = (ushort)((uint6)uVar29 >> 0x22);
      auVar40._6_2_ = (ushort)((ulong)uVar30 >> 0x32);
      auVar40._8_2_ = (ushort)((unkuint10)auVar31._0_10_ >> 0x42);
      auVar40._10_2_ = auVar31._10_2_ >> 2;
      auVar40._12_2_ = auVar33._12_2_ >> 2;
      auVar40._14_2_ = auVar39._14_2_ >> 2;
      auVar40 = auVar40 & _DAT_00135080;
      cVar43 = auVar40[0] + auVar25[0];
      bVar54 = auVar40[1] + auVar25[1];
      uVar27 = CONCAT11(bVar54,cVar43);
      cVar53 = auVar40[2] + auVar25[2];
      bVar56 = auVar40[3] + auVar25[3];
      uVar28 = CONCAT13(bVar56,CONCAT12(cVar53,uVar27));
      cVar55 = auVar40[4] + auVar25[4];
      bVar58 = auVar40[5] + auVar25[5];
      uVar29 = CONCAT15(bVar58,CONCAT14(cVar55,uVar28));
      cVar57 = auVar40[6] + auVar25[6];
      bVar60 = auVar40[7] + auVar25[7];
      uVar30 = CONCAT17(bVar60,CONCAT16(cVar57,uVar29));
      cVar59 = auVar40[8] + auVar25[8];
      bVar42 = auVar40[9] + auVar25[9];
      auVar32._0_10_ = CONCAT19(bVar42,CONCAT18(cVar59,uVar30));
      auVar32[10] = auVar40[10] + auVar25[10];
      auVar32[0xb] = auVar40[0xb] + auVar25[0xb];
      auVar34[0xc] = auVar40[0xc] + auVar25[0xc];
      auVar34._0_12_ = auVar32;
      auVar34[0xd] = auVar40[0xd] + auVar25[0xd];
      auVar41[0xe] = auVar40[0xe] + auVar25[0xe];
      auVar41._0_14_ = auVar34;
      auVar41[0xf] = auVar40[0xf] + auVar25[0xf];
      auVar26[0] = (char)(uVar27 >> 4) + cVar43;
      auVar26[1] = (bVar54 >> 4) + bVar54;
      auVar26[2] = (char)(ushort)((uint)uVar28 >> 0x14) + cVar53;
      auVar26[3] = (bVar56 >> 4) + bVar56;
      auVar26[4] = (char)(ushort)((uint6)uVar29 >> 0x24) + cVar55;
      auVar26[5] = (bVar58 >> 4) + bVar58;
      auVar26[6] = (char)(ushort)((ulong)uVar30 >> 0x34) + cVar57;
      auVar26[7] = (bVar60 >> 4) + bVar60;
      auVar26[8] = (char)(ushort)((unkuint10)auVar32._0_10_ >> 0x44) + cVar59;
      auVar26[9] = (bVar42 >> 4) + bVar42;
      auVar26[10] = (char)(auVar32._10_2_ >> 4) + auVar32[10];
      auVar26[0xb] = (auVar32[0xb] >> 4) + auVar32[0xb];
      auVar26[0xc] = (char)(auVar34._12_2_ >> 4) + auVar34[0xc];
      auVar26[0xd] = (auVar34[0xd] >> 4) + auVar34[0xd];
      auVar26[0xe] = (char)(auVar41._14_2_ >> 4) + auVar41[0xe];
      auVar26[0xf] = (auVar41[0xf] >> 4) + auVar41[0xf];
      auVar25 = psadbw((undefined1  [16])0x0,auVar26 & _DAT_00135090);
      uVar15 = (uint)bVar52;
      if (uVar19 == 0) {
        uVar15 = 0;
      }
      uVar14 = (uint)bVar52;
      if (uVar3 == 0) {
        uVar14 = 0;
      }
      iVar12 = ((uVar15 + uVar23) - uVar14) + (auVar25._0_4_ - auVar25._8_4_) * 2;
      uVar23 = (uint)((byte)(bVar52 << 2) / 3);
      iVar13 = (iVar12 - uVar23) + 0x1c;
      if (this->pc[8] == 0) {
        iVar13 = iVar12;
      }
      iVar12 = uVar23 - 0x1c;
      if (this->pc[9] == 0) {
        iVar12 = 0;
      }
      uVar23 = iVar12 + iVar13;
      uVar16 = this->pinfo[0].connected << 8 & this->pinfo[1].connected;
      if (((uVar16 != 0) && (uVar16 = (~uVar16 >> 1 | 0x80808080808080ff) & uVar16, uVar16 != 0)) &&
         (uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555),
         uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
         uVar16 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101,
         2 < uVar16 >> 0x38)) {
        uVar23 = (int)(uVar23 * (10 - (uint)(byte)(uVar16 >> 0x38))) / 8;
      }
    }
    uVar17 = MajorsAndMinors<false>(this);
    uVar18 = MajorsAndMinors<true>(this);
    uVar4 = this->pc[8];
    bVar24 = true;
    bVar8 = true;
    if ((((this->pc[2] == 0 && uVar4 == 0) && this->pc[10] == 0) &&
        (uVar16 = this->pc[6], (uVar16 & uVar16 - 1) == 0)) && ((uVar16 == 0 || (this->pc[4] == 0)))
       ) {
      uVar16 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
      uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
      bVar8 = 2 < (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
    uVar5 = this->pc[9];
    if ((((this->pc[3] != 0 || uVar5 != 0) || this->pc[0xb] != 0) ||
        (uVar16 = this->pc[7], (uVar16 & uVar16 - 1) != 0)) ||
       (((uVar16 != 0 && (this->pc[5] != 0)) ||
        (uVar16 = uVar18 - (uVar18 >> 1 & 0x5555555555555555),
        uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
        bVar24 = 2 < (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           ), bVar24 || bVar8 != false)))) {
      if ((byte)(((int)uVar23 < 1 | bVar8) & (-1 < (int)uVar23 | bVar24)) == 0) {
        if (bVar8 == bVar24) {
          __assert_fail("whiteCanWin != blackCanWin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x786,"void bitfoot::Bitfoot::Evaluate()");
        }
        uVar15 = -uVar23;
        if (0 < (int)uVar23) {
          uVar15 = uVar23;
        }
        if (999 < uVar15) {
          __assert_fail("abs(eval) < 1000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x787,"void bitfoot::Bitfoot::Evaluate()");
        }
        iVar12 = (int)(uVar15 * uVar23) / 1000;
        uVar15 = iVar12 + 0x32;
        if (bVar8 == false) {
          uVar15 = iVar12 - 0x32;
        }
      }
      else {
        uVar15 = uVar23;
        if (this->pc[3] == 0 && this->pc[2] == 0) {
          if (uVar17 == 0) {
            uVar16 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
            uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
            uVar16 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
          }
          else {
            uVar16 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
            uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
            uVar19 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
            uVar16 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
            uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333);
            uVar16 = ((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
            if (((uVar16 < 2 && uVar19 >> 0x38 < 2) && uVar18 != 0) &&
               ((uVar18 == uVar5 && this->pc[10] == uVar17 ||
                (uVar17 == uVar4 && this->pc[0xb] == uVar18)))) {
              uVar15 = uVar23 + 0x50;
              if (0 < (int)uVar23) {
                uVar15 = uVar23 - 0x50;
              }
              goto LAB_001095d9;
            }
            if ((uVar17 == uVar4 && (byte)(uVar19 >> 0x38) < 2) &&
               (uVar16 < 3 && uVar18 == (this->pc[7] | this->pc[5]))) {
              uVar14 = -uVar23;
              if (0 < (int)uVar23) {
                uVar14 = uVar23;
              }
              if (uVar14 < 0x100) {
                iVar12 = uVar14 * uVar23;
                iVar13 = 0x100;
                goto LAB_00109514;
              }
            }
          }
          if (((uVar18 == uVar5 && uVar16 == 1) && (uVar17 == (this->pc[6] | this->pc[4]))) &&
             (uVar16 = uVar17 - (uVar17 >> 1 & 0x5555555555555555),
             uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
             (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) < 3))
          {
            uVar14 = -uVar23;
            if (0 < (int)uVar23) {
              uVar14 = uVar23;
            }
            if (uVar14 < 0x100) {
              uVar15 = (int)(uVar14 * uVar23) / 0x100;
            }
          }
        }
        else if (uVar5 == uVar18 && uVar4 == uVar17) {
          uVar14 = -uVar23;
          if (0 < (int)uVar23) {
            uVar14 = uVar23;
          }
          if (0x7f < uVar14) goto LAB_001092ee;
          iVar12 = uVar14 * uVar23;
          iVar13 = 0x80;
LAB_00109514:
          uVar15 = iVar12 / iVar13;
        }
        else {
LAB_001092ee:
          if ((uVar17 == this->pc[6]) && (uVar18 == this->pc[7])) {
            if ((uVar17 != 0) &&
               (((uVar17 & 0xaa55aa55aa55aa55) == 0) != ((uVar18 & 0xaa55aa55aa55aa55) == 0))) {
              uVar14 = -uVar23;
              if (0 < (int)uVar23) {
                uVar14 = uVar23;
              }
              if ((((uVar17 & uVar17 - 1) == 0) && (uVar18 != 0)) &&
                 ((uVar16 = uVar18 - (uVar18 >> 1 & 0x5555555555555555),
                  uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
                  (byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) <
                  2 && (uVar14 < 300)))) {
                if ((int)uVar23 < 1) {
                  uVar4 = this->pinfo[1].connected;
                }
                else {
                  uVar4 = this->pinfo[0].connected;
                }
                if (uVar4 == 0) {
                  uVar23 = (int)uVar23 / 3;
                  uVar14 = -uVar23;
                  if (0 < (int)uVar23) {
                    uVar14 = uVar23;
                  }
                }
                iVar12 = uVar14 * uVar23;
                iVar13 = 300;
                goto LAB_00109514;
              }
            }
          }
        }
      }
LAB_001095d9:
      uVar23 = -uVar15;
      if (0 < (int)uVar15) {
        uVar23 = uVar15;
      }
      if ((0x19 < this->rcount) && (8 < uVar23)) {
        uVar15 = (uint)((25.0 / (double)this->rcount) * (double)(int)uVar15);
      }
      uVar23 = -uVar15;
      if ((this->state & 1) == 0) {
        uVar23 = uVar15;
      }
      goto LAB_00109620;
    }
  }
  uVar23 = this->state;
  this->state = uVar23 | 0x20;
  uVar23 = (&_drawScore)[uVar23 & 1];
LAB_00109620:
  this->standPat = uVar23;
  return;
}

Assistant:

void Evaluate() {
#ifndef NDEBUG
    assert(!(state & Draw));
    memset(&evals, 0, sizeof(evals));
#endif
    memset(pinfo, 0, sizeof(pinfo));
    memset(atks, 0, sizeof(atks));
    atkCount[White] = 0;
    atkCount[Black] = 0;
    atkScore[White] = 0;
    atkScore[Black] = 0;

    // evaluate from white's perspective
    int eval = ((ColorToMove() ? -_tempo : _tempo) +
                material[White] -
                material[Black] +
                sqrVal[White] -
                sqrVal[Black] +
                GetPins<Black>(6) -
                GetPins<White>(6));

    // no pawns = bad
    if (pc[WhitePawn])   eval += PawnEval<White>(); else eval -= 50;
    if (pc[BlackPawn])   eval -= PawnEval<Black>(); else eval += 50;
    if (pc[WhiteKnight]) eval += KnightEval<White>();
    if (pc[BlackKnight]) eval -= KnightEval<Black>();
    if (pc[WhiteBishop]) eval += BishopEval<White>();
    if (pc[BlackBishop]) eval -= BishopEval<Black>();
    if (pc[WhiteRook])   eval += RookEval<White>();
    if (pc[BlackRook])   eval -= RookEval<Black>();
    if (pc[WhiteQueen])  eval += QueenEval<White>();
    if (pc[BlackQueen])  eval -= QueenEval<Black>();

    // fill in attack bitmaps sans king attacks
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]);

    eval += KingEval<White>();
    eval -= KingEval<Black>();

    // finish populating attack bitmaps
    atks[WhiteKing] = _KING_ATK[king[White]];
    atks[BlackKing] = _KING_ATK[king[Black]];
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]  | atks[WhiteKing]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]  | atks[BlackKing]);

    // now that attack bitmaps are complete evaluate passed pawns
    if (pinfo[White].passed) eval += PasserEval<White>();
    if (pinfo[Black].passed) eval -= PasserEval<Black>();

#ifndef NDEBUG
    VerifyPosition();
#endif

    // NOTE: if draw due to rcount this destabilizes the transposition table
    //       because rcount is not encoded into positionKey
    if (IsDraw()) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // TODO use specialized eval function for particular piece configurations

    // bonus for board coverage
    uint64_t x;
    x = (atks[WhitePawn]|atks[WhiteKnight]|atks[WhiteBishop]|atks[WhiteRook]|
         (atks[WhiteQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval += (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));
    x = (atks[BlackPawn]|atks[BlackKnight]|atks[BlackBishop]|atks[BlackRook]|
         (atks[BlackQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval -= (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));

    // penalty for unprotected pawns, knights, and bishops
    if ((x = ((pc[WhitePawn]|MinorPieces<White>()) & ~atks[White]))) {
      eval -= (6 * BitCount(x));
    }
    if ((x = ((pc[BlackPawn]|MinorPieces<Black>()) & ~atks[Black]))) {
      eval += (6 * BitCount(x));
    }

    // redundant knights are worth slightly less
    if (MULTI_BIT(pc[WhiteKnight])) {
      eval -= (16 * (BitCount(pc[WhiteKnight]) - 1));
    }
    if (MULTI_BIT(pc[BlackKnight])) {
      eval += (16 * (BitCount(pc[BlackKnight]) - 1));
    }

    // are there any pawns on the board?
    if (pc[WhitePawn] || pc[BlackPawn]) {
      assert(pinfo[White].count == BitCount(pc[WhitePawn]));
      assert(pinfo[Black].count == BitCount(pc[BlackPawn]));

      // bonus for uncontested contiguous vertical space behind connected pawns
      x = (pinfo[White].behind & ~atks[Black]);
      x &= (x >> 8);
      eval += (2 * BitCount(x));
      x = (pinfo[Black].behind & ~atks[White]);
      x &= (x >> 8);
      eval -= (2 * BitCount(x));

      // increase value of 1 knight relative to # of pawns on the board
      int count = ((4 * (pinfo[White].count + pinfo[Black].count)) / 3);
      assert(count <= 21);
      if (pc[WhiteKnight]) {
        eval += count;
      }
      if (pc[BlackKnight]) {
        eval -= count;
      }

      // increase value of 1 rook as pawns come off the board
      count = ((4 * count) / 3); // inflate pawn count a bit more
      assert(count <= 28);
      if (pc[WhiteRook]) {
        eval += (28 - count);
      }
      if (pc[BlackRook]) {
        eval -= (28 - count);
      }

      // reduce winning score relative to number of locked pawns
      if ((x = ((pinfo[White].connected << North) & pinfo[Black].connected))) {
        if ((x &= ~((x & ~_FILE[0]) >> 1))) {
          if ((count = BitCount(x)) > 2) {
            eval = ((eval * (10 - count)) / 8);
          }
        }
      }
    }

    // draw due to lack of mating material?
    const uint64_t whitePcs = MajorsAndMinors<White>();
    const uint64_t blackPcs = MajorsAndMinors<Black>();
    const bool whiteCanWin  = (pc[WhitePawn] || pc[WhiteRook] ||
                               pc[WhiteQueen] || MULTI_BIT(pc[WhiteBishop]) ||
                               (pc[WhiteKnight] && pc[WhiteBishop]) ||
                               (BitCount(whitePcs) > 2));
    const bool blackCanWin  = (pc[BlackPawn] || pc[BlackRook] ||
                               pc[BlackQueen] || MULTI_BIT(pc[BlackBishop]) ||
                               (pc[BlackKnight] && pc[BlackBishop]) ||
                               (BitCount(blackPcs) > 2));
    if (!whiteCanWin && !blackCanWin) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // reduce winning score if "winning" side can't win
    if (((eval > 0) && !whiteCanWin) || ((eval < 0) && !blackCanWin)) {
      assert(whiteCanWin != blackCanWin);
      assert(abs(eval) < 1000);
      eval = ((eval * abs(eval)) / 1000);
      eval += (whiteCanWin ? 50 : -50);
    }

    else if (!pc[WhitePawn] && !pc[BlackPawn]) {
      // reduce winning score if Q vs R
      if (SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
          (((whitePcs == pc[WhiteQueen]) && (blackPcs == pc[BlackRook])) ||
           ((blackPcs == pc[BlackQueen]) && (whitePcs == pc[WhiteRook]))))
      {
        eval -= ((eval > 0) ? 80 : -80);
      }

      // reduce winning score if R vs minor(s)
      else if (SINGLE_BIT(whitePcs) && (whitePcs == pc[WhiteRook]) &&
               (blackPcs == MinorPieces<Black>()) &&
               (BitCount(blackPcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
      else if (SINGLE_BIT(blackPcs) && (blackPcs == pc[BlackRook]) &&
               (whitePcs == MinorPieces<White>()) &&
               (BitCount(whitePcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
    }

    // reduce winning score if pawns + R vs R ending
    else if ((whitePcs == pc[WhiteRook]) && (blackPcs == pc[BlackRook]) &&
             (abs(eval) < 128))
    {
      eval = ((eval * abs(eval)) / 128);
    }

    // reduce winning score if pawns + opposite color bishop ending
    else if ((whitePcs == pc[WhiteBishop]) && (blackPcs == pc[BlackBishop]) &&
             (!(whitePcs & _LIGHT) != !(blackPcs & _LIGHT)) &&
             SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
             (abs(eval) < 300))
    {
      if ((eval > 0) ? !pinfo[White].connected : !pinfo[Black].connected) {
        eval /= 3;
      }
      eval = ((eval * abs(eval)) / 300);
    }

    // reduce winning score if rcount is getting large
    // NOTE: this destabilizes transposition table values
    //       because rcount is not encoded into positionKey
    if ((rcount > 25) && (abs(eval) > 8)) {
      eval = static_cast<int>(eval * (25.0 / rcount));
    }

    // standPat is eval from persepctive of the side to move
    standPat = (ColorToMove() ? -eval : eval);
  }